

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CreateRawTransaction_Test::TestBody
          (cfdcapi_elements_transaction_CreateRawTransaction_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  void *in_RDI;
  char *in_R9;
  char *in_stack_00000010;
  char *in_stack_00000018;
  char **in_stack_00000020;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  char *str_buffer_1;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  char *str_buffer;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uint32_t index;
  int64_t satoshi;
  char *tx_string2;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff6f8;
  AssertionResult *in_stack_fffffffffffff700;
  char **in_stack_fffffffffffff708;
  char *in_stack_fffffffffffff710;
  void **in_stack_fffffffffffff718;
  void *in_stack_fffffffffffff738;
  AssertionResult *pAVar4;
  char **in_stack_fffffffffffff790;
  AssertionResult *in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ef;
  undefined8 in_stack_fffffffffffff7f0;
  void *in_stack_fffffffffffff7f8;
  AssertionResult *in_stack_fffffffffffff948;
  uint32_t in_stack_fffffffffffff954;
  char *in_stack_fffffffffffff958;
  AssertionResult *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  AssertHelper local_5a8;
  Message local_5a0;
  undefined4 local_594;
  AssertionResult local_590;
  AssertHelper local_580;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa88;
  uint32_t in_stack_fffffffffffffa90;
  uint32_t in_stack_fffffffffffffa94;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa98;
  AssertHelper in_stack_fffffffffffffaa0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaa8;
  AssertionResult local_548;
  char *local_538;
  AssertHelper local_530;
  Message local_528;
  undefined4 local_51c;
  AssertionResult local_518;
  AssertHelper local_508;
  Message local_500;
  undefined4 local_4f4;
  AssertionResult local_4f0;
  AssertHelper local_4e0;
  Message local_4d8;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8;
  char *local_498;
  AssertHelper local_490;
  Message local_488;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  undefined4 local_45c;
  AssertionResult local_458;
  AssertHelper local_448;
  Message local_440;
  undefined4 local_434;
  AssertionResult local_430;
  AssertHelper local_420;
  Message local_418;
  undefined4 local_40c;
  AssertionResult local_408;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined4 local_3e4;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3bc;
  AssertionResult local_3b8;
  AssertHelper local_3a8;
  Message local_3a0;
  undefined4 local_394;
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378;
  undefined4 local_36c;
  AssertionResult local_368;
  AssertHelper local_358;
  Message local_350;
  undefined4 local_344;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  undefined4 local_31c;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  undefined4 local_2f4;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined4 local_2cc;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  AssertionResult local_2a8;
  AssertHelper local_298;
  Message local_290;
  undefined4 local_284;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248;
  undefined4 local_23c;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  undefined4 local_b4;
  undefined8 local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  char *in_stack_ffffffffffffffd8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  char *pcVar6;
  
  pcVar6 = (char *)0x0;
  CfdCreateHandle(in_stack_fffffffffffff718);
  uVar5 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x331f6a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x331fcd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x332022);
  local_61 = pcVar6 != (char *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,(type *)0x332056);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x332152);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3321cd);
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_b4 = 0;
  iVar2 = CfdInitializeConfidentialTx
                    (in_stack_fffffffffffff7f8,(uint32_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                     (uint32_t)in_stack_fffffffffffff7f0,
                     (char **)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3322c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x332323);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x332378);
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_f0,"\"0200000000000000000000\"","tx_string",
               "0200000000000000000000",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x332427);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x29,pcVar3);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      testing::Message::~Message((Message *)0x33248a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3324e2);
    iVar2 = CfdAddConfidentialTxIn
                      (in_stack_fffffffffffffaa8.ptr_,(char *)in_stack_fffffffffffffaa0.data_,
                       (char *)in_stack_fffffffffffffa98.ptr_,in_stack_fffffffffffffa94,
                       in_stack_fffffffffffffa90,(char **)in_stack_fffffffffffffa88.ptr_);
    local_114 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3325c2);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x332625);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33267a);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_a0 = local_a8;
    local_a8 = (char *)0x0;
  }
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_138,
               "\"020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000\""
               ,"tx_string",
               "020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x332754);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x36,pcVar3);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x3327b7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33280f);
    iVar2 = CfdAddConfidentialTxIn
                      (in_stack_fffffffffffffaa8.ptr_,(char *)in_stack_fffffffffffffaa0.data_,
                       (char *)in_stack_fffffffffffffa98.ptr_,in_stack_fffffffffffffa94,
                       in_stack_fffffffffffffa90,(char **)in_stack_fffffffffffffa88.ptr_);
    local_15c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3328f2);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x332955);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3329aa);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_a0 = local_a8;
    local_a8 = (char *)0x0;
  }
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_180,
               "\"020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000\""
               ,"tx_string",
               "020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x332a84);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x43,pcVar3);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::Message::~Message((Message *)0x332ae7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x332b3f);
    iVar2 = CfdAddConfidentialTxIn
                      (in_stack_fffffffffffffaa8.ptr_,(char *)in_stack_fffffffffffffaa0.data_,
                       (char *)in_stack_fffffffffffffa98.ptr_,in_stack_fffffffffffffa94,
                       in_stack_fffffffffffffa90,(char **)in_stack_fffffffffffffa88.ptr_);
    local_1a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x332c22);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x48,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x332c85);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x332cda);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_a0 = local_a8;
    local_a8 = (char *)0x0;
  }
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1c8,
               "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000\""
               ,"tx_string",
               "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x332db4);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x332e17);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x332e6f);
    local_b4 = 0;
    iVar2 = CfdGetConfidentialTxInIndex
                      ((void *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                       &in_stack_fffffffffffff960->success_,in_stack_fffffffffffff958,
                       in_stack_fffffffffffff954,(uint32_t *)in_stack_fffffffffffff948);
    local_1ec = 0;
    in_stack_fffffffffffff960 = &local_1e8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    in_stack_fffffffffffff96f =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff960);
    if (!(bool)in_stack_fffffffffffff96f) {
      testing::Message::Message(&local_1f8);
      in_stack_fffffffffffff958 =
           testing::AssertionResult::failure_message((AssertionResult *)0x332f57);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x56,in_stack_fffffffffffff958);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x332fba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33300f);
    local_214 = 1;
    in_stack_fffffffffffff948 = &local_210;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (int *)in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff948);
    in_stack_fffffffffffff954 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff954);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3330bc);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x57,pcVar3);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x33311f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x333174);
  }
  if (iVar2 == 0) {
    local_b0 = 100000000;
    in_stack_fffffffffffff708 = &local_a8;
    in_stack_fffffffffffff700 = (AssertionResult *)0x0;
    in_stack_fffffffffffff6f8 = (bool *)0x0;
    iVar2 = CfdAddConfidentialTxOut
                      (in_RDI,pcVar6,(char *)(ulong)in_stack_ffffffffffffffe8,
                       (int64_t)in_stack_ffffffffffffffe0.ptr_,in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),in_stack_00000010,
                       in_stack_00000018,in_stack_00000020);
    local_23c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x333292);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x60,pcVar3);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      testing::Message::~Message((Message *)0x3332f5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33334a);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_a0 = local_a8;
    local_a8 = (char *)0x0;
  }
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_260,
               "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000\""
               ,"tx_string",
               "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x333424);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x68,pcVar3);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x333487);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3334df);
    local_b0 = 0x71475420;
    in_stack_fffffffffffff708 = &local_a8;
    in_stack_fffffffffffff700 = (AssertionResult *)0x0;
    in_stack_fffffffffffff6f8 = (bool *)0x0;
    iVar2 = CfdAddConfidentialTxOut
                      (in_RDI,pcVar6,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                       (int64_t)in_stack_ffffffffffffffe0.ptr_,in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),in_stack_00000010,
                       in_stack_00000018,in_stack_00000020);
    local_284 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3335ed);
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x6f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_298,&local_290);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      testing::Message::~Message((Message *)0x333650);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3336a5);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_a0 = local_a8;
    local_a8 = (char *)0x0;
  }
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2a8,
               "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000\""
               ,"tx_string",
               "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
    if (!bVar1) {
      testing::Message::Message(&local_2b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x33377f);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      testing::Message::~Message((Message *)0x3337e2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33383a);
    local_b0 = 500000;
    in_stack_fffffffffffff708 = &local_a8;
    in_stack_fffffffffffff700 = (AssertionResult *)0x0;
    in_stack_fffffffffffff6f8 = (bool *)0x0;
    iVar2 = CfdAddConfidentialTxOut
                      (in_RDI,pcVar6,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                       (int64_t)in_stack_ffffffffffffffe0.ptr_,in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),in_stack_00000010,
                       in_stack_00000018,in_stack_00000020);
    local_2cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x333944);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x7e,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message((Message *)0x3339a7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3339fc);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_a0 = local_a8;
    local_a8 = (char *)0x0;
  }
  if (iVar2 == 0) {
    iVar2 = CfdGetConfidentialTxOutIndex
                      (in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (uint32_t *)in_stack_ffffffffffffffb8.ptr_);
    local_2f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_300);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x333b11);
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x89,pcVar6);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::Message::~Message((Message *)0x333b74);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x333bc9);
    local_31c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (int *)in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700,
               in_stack_fffffffffffff6f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar1) {
      testing::Message::Message(&local_328);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x333c7b);
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x8a,pcVar6);
      testing::internal::AssertHelper::operator=(&local_330,&local_328);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      testing::Message::~Message((Message *)0x333cde);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x333d33);
  }
  if (iVar2 == 0) {
    iVar2 = CfdGetConfidentialTxOutIndex
                      (in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (uint32_t *)in_stack_ffffffffffffffb8.ptr_);
    local_344 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
    if (!bVar1) {
      testing::Message::Message(&local_350);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x333e22);
      testing::internal::AssertHelper::AssertHelper
                (&local_358,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x90,pcVar6);
      testing::internal::AssertHelper::operator=(&local_358,&local_350);
      testing::internal::AssertHelper::~AssertHelper(&local_358);
      testing::Message::~Message((Message *)0x333e85);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x333eda);
    local_36c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (int *)in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700,
               in_stack_fffffffffffff6f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_368);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x333f8c);
      testing::internal::AssertHelper::AssertHelper
                (&local_380,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x91,pcVar6);
      testing::internal::AssertHelper::operator=(&local_380,&local_378);
      testing::internal::AssertHelper::~AssertHelper(&local_380);
      testing::Message::~Message((Message *)0x333fef);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x334044);
  }
  if (iVar2 == 0) {
    iVar2 = CfdGetConfidentialTxOutIndex
                      (in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (uint32_t *)in_stack_ffffffffffffffb8.ptr_);
    local_394 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3a0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x334130);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x98,pcVar6);
      testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      testing::Message::~Message((Message *)0x334193);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3341e8);
    local_3bc = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (int *)in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3c8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x334295);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x99,pcVar6);
      testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      testing::Message::~Message((Message *)0x3342f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33434d);
  }
  if (iVar2 == 0) {
    iVar2 = CfdGetConfidentialTxOutIndex
                      (in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (uint32_t *)in_stack_ffffffffffffffb8.ptr_);
    local_3e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x33443c);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x9f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      testing::Message::~Message((Message *)0x33449f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3344f4);
    local_40c = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (int *)in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3345a1);
      testing::internal::AssertHelper::AssertHelper
                (&local_420,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xa0,pcVar6);
      testing::internal::AssertHelper::operator=(&local_420,&local_418);
      testing::internal::AssertHelper::~AssertHelper(&local_420);
      testing::Message::~Message((Message *)0x334604);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x334659);
  }
  if (iVar2 == 0) {
    iVar2 = CfdGetConfidentialTxOutIndex
                      (in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (uint32_t *)in_stack_ffffffffffffffb8.ptr_);
    local_434 = 0;
    pAVar4 = &local_430;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_440);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x334741);
      testing::internal::AssertHelper::AssertHelper
                (&local_448,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xa6,pcVar6);
      testing::internal::AssertHelper::operator=(&local_448,&local_440);
      testing::internal::AssertHelper::~AssertHelper(&local_448);
      testing::Message::~Message((Message *)0x3347a4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3347f9);
    local_45c = 2;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (int *)in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_458);
    if (!bVar1) {
      testing::Message::Message(&local_468);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x3348a6);
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xa7,pcVar6);
      testing::internal::AssertHelper::operator=(&local_470,&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      testing::Message::~Message((Message *)0x334909);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33495e);
  }
  if (iVar2 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_480,
               "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000\""
               ,"tx_string",
               "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
               ,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
    if (!bVar1) {
      testing::Message::Message(&local_488);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x334a0f);
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xab,pcVar6);
      testing::internal::AssertHelper::operator=(&local_490,&local_488);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      testing::Message::~Message((Message *)0x334a72);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x334ac7);
  }
  iVar2 = CfdGetLastErrorCode(in_stack_fffffffffffff738);
  if (iVar2 != 0) {
    local_498 = (char *)0x0;
    iVar2 = CfdGetLastErrorMessage(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
    local_4ac = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
    if (!bVar1) {
      testing::Message::Message(&local_4b8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x334bc0);
      testing::internal::AssertHelper::AssertHelper
                (&local_4c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xb2,pcVar6);
      testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4c0);
      testing::Message::~Message((Message *)0x334c23);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x334c78);
    in_stack_fffffffffffff798 = &local_4d0;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffff798,"\"\"","str_buffer","",local_498);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff798);
    if (!bVar1) {
      testing::Message::Message(&local_4d8);
      in_stack_fffffffffffff790 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x334d19);
      testing::internal::AssertHelper::AssertHelper
                (&local_4e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xb3,(char *)in_stack_fffffffffffff790);
      testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
      testing::internal::AssertHelper::~AssertHelper(&local_4e0);
      testing::Message::~Message((Message *)0x334d7c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x334dd1);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_498 = (char *)0x0;
  }
  if (iVar2 == 0) {
    iVar2 = CfdGetConfidentialTxInIndex
                      ((void *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                       &in_stack_fffffffffffff960->success_,in_stack_fffffffffffff958,
                       in_stack_fffffffffffff954,(uint32_t *)in_stack_fffffffffffff948);
    local_4f4 = 1;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
    if (!bVar1) {
      testing::Message::Message(&local_500);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x334ed7);
      testing::internal::AssertHelper::AssertHelper
                (&local_508,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xbc,pcVar6);
      testing::internal::AssertHelper::operator=(&local_508,&local_500);
      testing::internal::AssertHelper::~AssertHelper(&local_508);
      testing::Message::~Message((Message *)0x334f3a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x334f8f);
    if (iVar2 == 1) {
      iVar2 = 0;
    }
  }
  if (iVar2 == 0) {
    CfdGetConfidentialTxOutIndex
              (in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (uint32_t *)in_stack_ffffffffffffffb8.ptr_);
    local_51c = 1;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
    if (!bVar1) {
      testing::Message::Message(&local_528);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x335086);
      testing::internal::AssertHelper::AssertHelper
                (&local_530,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xc5,pcVar6);
      testing::internal::AssertHelper::operator=(&local_530,&local_528);
      testing::internal::AssertHelper::~AssertHelper(&local_530);
      testing::Message::~Message((Message *)0x3350e3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x335138);
  }
  iVar2 = CfdGetLastErrorCode(in_stack_fffffffffffff738);
  if (iVar2 != 0) {
    local_538 = (char *)0x0;
    CfdGetLastErrorMessage(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
               (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_548);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffaa8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x33523c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffaa0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xcf,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffaa0,(Message *)&stack0xfffffffffffffaa8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffaa0);
      testing::Message::~Message((Message *)0x335299);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3352ee);
    pAVar4 = (AssertionResult *)&stack0xfffffffffffffa90;
    testing::internal::CmpHelperSTREQ
              ((internal *)pAVar4,"\"Failed to parameter. search target is not found.\"",
               "str_buffer","Failed to parameter. search target is not found.",local_538);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffa88);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x335383);
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xd0,pcVar6);
      testing::internal::AssertHelper::operator=(&local_580,(Message *)&stack0xfffffffffffffa88);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      testing::Message::~Message((Message *)0x3353e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x335435);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
    local_538 = (char *)0x0;
  }
  if (local_a0 != (char *)0x0) {
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff708);
  }
  CfdFreeHandle(in_stack_fffffffffffff708);
  local_594 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             (CfdErrorCode *)in_stack_fffffffffffff708,(int *)in_stack_fffffffffffff700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x33551d);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xda,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message((Message *)0x33557a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3355cf);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CreateRawTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  int64_t satoshi;
  uint32_t index = 0;

  ret = CfdInitializeConfidentialTx(handle, 2, 0, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0200000000000000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd", 0,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 2,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000", tx_string);

    index = 0;
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    satoshi = 100000000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751",
      satoshi, nullptr, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000", tx_string);

    satoshi = 1900500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000", tx_string);

    satoshi = 500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, nullptr,
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914fdd725970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, NULL, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, index);
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000", tx_string);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 3,
      &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, "76a914fdd825970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("Failed to parameter. search target is not found.", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (tx_string != nullptr) {
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}